

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void __thiscall
clickhouse::ColumnVector<signed_char>::Append(ColumnVector<signed_char> *this,ColumnRef *column)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  iterator this_00;
  Column *in_RSI;
  shared_ptr<clickhouse::ColumnVector<signed_char>_> col;
  vector<signed_char,_std::allocator<signed_char>_> *in_stack_ffffffffffffff78;
  __normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
  *in_stack_ffffffffffffff80;
  const_iterator in_stack_ffffffffffffffd8;
  __shared_ptr local_20 [32];
  
  std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x213573);
  Column::As<clickhouse::ColumnVector<signed_char>>(in_RSI);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
  if (bVar1) {
    __first = std::vector<signed_char,_std::allocator<signed_char>_>::end(in_stack_ffffffffffffff78)
    ;
    __gnu_cxx::
    __normal_iterator<signed_char_const*,std::vector<signed_char,std::allocator<signed_char>>>::
    __normal_iterator<signed_char*>
              (in_stack_ffffffffffffff80,
               (__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                *)in_stack_ffffffffffffff78);
    std::
    __shared_ptr_access<clickhouse::ColumnVector<signed_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<clickhouse::ColumnVector<signed_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2135c9);
    __last = std::vector<signed_char,_std::allocator<signed_char>_>::begin
                       (in_stack_ffffffffffffff78);
    std::
    __shared_ptr_access<clickhouse::ColumnVector<signed_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<clickhouse::ColumnVector<signed_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2135e4);
    this_00 = std::vector<signed_char,_std::allocator<signed_char>_>::end(in_stack_ffffffffffffff78)
    ;
    std::vector<signed_char,std::allocator<signed_char>>::
    insert<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,void>
              ((vector<signed_char,_std::allocator<signed_char>_> *)this_00._M_current,
               in_stack_ffffffffffffffd8,
               (__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                )__first._M_current,
               (__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                )__last._M_current);
  }
  std::shared_ptr<clickhouse::ColumnVector<signed_char>_>::~shared_ptr
            ((shared_ptr<clickhouse::ColumnVector<signed_char>_> *)0x213645);
  return;
}

Assistant:

void ColumnVector<T>::Append(ColumnRef column) {
    if (auto col = column->As<ColumnVector<T>>()) {
        data_.insert(data_.end(), col->data_.begin(), col->data_.end());
    }
}